

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

void optimized::outputAttrmap
               (DefaultInitVec<AttrmapEntry> *attrmap,DefaultInitVec<size_t> *mappings)

{
  bool bVar1;
  _Ios_Openmode __oflag;
  int iVar2;
  path *ppVar3;
  undefined4 extraout_var;
  char *pcVar4;
  int *piVar5;
  char *pcVar6;
  reference this;
  streambuf *psVar7;
  uint8_t attr;
  AttrmapEntry *entry;
  const_iterator __end1;
  const_iterator __begin1;
  DefaultInitVec<AttrmapEntry> *__range1;
  undefined1 local_110 [8];
  File output;
  DefaultInitVec<size_t> *mappings_local;
  DefaultInitVec<AttrmapEntry> *attrmap_local;
  
  output._file.
  super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
  .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._240_8_ =
       mappings;
  File::File((File *)local_110);
  ppVar3 = std::optional<std::filesystem::__cxx11::path>::operator*(&options.attrmap);
  __oflag = std::operator|(_S_out,_S_bin);
  iVar2 = File::open((File *)local_110,(char *)ppVar3,__oflag);
  if (CONCAT44(extraout_var,iVar2) == 0) {
    ppVar3 = std::optional<std::filesystem::__cxx11::path>::operator*(&options.attrmap);
    File::string((string *)&__range1,(File *)local_110,ppVar3);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &__range1);
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fatal("Failed to create \"%s\": %s",pcVar4,pcVar6);
  }
  __end1 = std::
           vector<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
           ::begin(attrmap);
  entry = (AttrmapEntry *)
          std::
          vector<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
          ::end(attrmap);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_AttrmapEntry_*,_std::vector<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>_>
                      (&__end1,(__normal_iterator<const_AttrmapEntry_*,_std::vector<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>_>
                                *)&entry);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    this = __gnu_cxx::
           __normal_iterator<const_AttrmapEntry_*,_std::vector<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>_>
           ::operator*(&__end1);
    AttrmapEntry::getPalID
              (this,(DefaultInitVec<size_t> *)
                    output._file.
                    super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                    .
                    super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                    .
                    super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                    .super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                    .super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                    .
                    super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                    ._240_8_);
    psVar7 = File::operator->((File *)local_110);
    std::streambuf::sputc((char)psVar7);
    __gnu_cxx::
    __normal_iterator<const_AttrmapEntry_*,_std::vector<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>_>
    ::operator++(&__end1);
  }
  File::~File((File *)local_110);
  return;
}

Assistant:

static void outputAttrmap(DefaultInitVec<AttrmapEntry> const &attrmap,
                          DefaultInitVec<size_t> const &mappings) {
	File output;
	if (!output.open(*options.attrmap, std::ios_base::out | std::ios_base::binary)) {
		fatal("Failed to create \"%s\": %s", output.string(*options.attrmap).c_str(),
		      strerror(errno));
	}

	for (AttrmapEntry const &entry : attrmap) {
		uint8_t attr = entry.xFlip << 5 | entry.yFlip << 6;
		attr |= entry.bank << 3;
		attr |= entry.getPalID(mappings) & 7;
		output->sputc(attr);
	}
}